

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

MatchInfoCollection * __thiscall
icu_63::TimeZoneNamesImpl::find
          (TimeZoneNamesImpl *this,UnicodeString *text,int32_t start,uint32_t types,
          UErrorCode *status)

{
  UBool UVar1;
  Mutex local_60;
  Mutex lock;
  TimeZoneNamesImpl *nonConstThis;
  MatchInfoCollection *matches;
  ZNameSearchHandler handler;
  UErrorCode *status_local;
  uint32_t types_local;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneNamesImpl *this_local;
  
  handler.fResults = (MatchInfoCollection *)status;
  ZNameSearchHandler::ZNameSearchHandler((ZNameSearchHandler *)&matches,types);
  lock.fMutex = (UMutex *)this;
  Mutex::Mutex(&local_60,(UMutex *)gDataMutex);
  this_local = (TimeZoneNamesImpl *)
               doFind(this,(ZNameSearchHandler *)&matches,text,start,(UErrorCode *)handler.fResults)
  ;
  UVar1 = ::U_FAILURE(*(UErrorCode *)&(handler.fResults)->_vptr_MatchInfoCollection);
  if (UVar1 == '\0') {
    if (this_local == (TimeZoneNamesImpl *)0x0) {
      addAllNamesIntoTrie((TimeZoneNamesImpl *)lock.fMutex,(UErrorCode *)handler.fResults);
      this_local = (TimeZoneNamesImpl *)
                   doFind(this,(ZNameSearchHandler *)&matches,text,start,
                          (UErrorCode *)handler.fResults);
      UVar1 = ::U_FAILURE(*(UErrorCode *)&(handler.fResults)->_vptr_MatchInfoCollection);
      if (UVar1 == '\0') {
        if (this_local == (TimeZoneNamesImpl *)0x0) {
          internalLoadAllDisplayNames
                    ((TimeZoneNamesImpl *)lock.fMutex,(UErrorCode *)handler.fResults);
          addAllNamesIntoTrie((TimeZoneNamesImpl *)lock.fMutex,(UErrorCode *)handler.fResults);
          lock.fMutex[6].fMutex.__size[0x10] = '\x01';
          UVar1 = ::U_FAILURE(*(UErrorCode *)&(handler.fResults)->_vptr_MatchInfoCollection);
          if (UVar1 == '\0') {
            this_local = (TimeZoneNamesImpl *)
                         doFind(this,(ZNameSearchHandler *)&matches,text,start,
                                (UErrorCode *)handler.fResults);
          }
          else {
            this_local = (TimeZoneNamesImpl *)0x0;
          }
        }
      }
      else {
        this_local = (TimeZoneNamesImpl *)0x0;
      }
    }
  }
  else {
    this_local = (TimeZoneNamesImpl *)0x0;
  }
  Mutex::~Mutex(&local_60);
  ZNameSearchHandler::~ZNameSearchHandler((ZNameSearchHandler *)&matches);
  return (MatchInfoCollection *)this_local;
}

Assistant:

TimeZoneNames::MatchInfoCollection*
TimeZoneNamesImpl::find(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    ZNameSearchHandler handler(types);
    TimeZoneNames::MatchInfoCollection* matches;
    TimeZoneNamesImpl* nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Synchronize so that data is not loaded multiple times.
    // TODO: Consider more fine-grained synchronization.
    {
        Mutex lock(&gDataMutex);

        // First try of lookup.
        matches = doFind(handler, text, start, status);
        if (U_FAILURE(status)) { return NULL; }
        if (matches != NULL) {
            return matches;
        }

        // All names are not yet loaded into the trie.
        // We may have loaded names for formatting several time zones,
        // and might be parsing one of those.
        // Populate the parsing trie from all of the already-loaded names.
        nonConstThis->addAllNamesIntoTrie(status);

        // Second try of lookup.
        matches = doFind(handler, text, start, status);
        if (U_FAILURE(status)) { return NULL; }
        if (matches != NULL) {
            return matches;
        }

        // There are still some names we haven't loaded into the trie yet.
        // Load everything now.
        nonConstThis->internalLoadAllDisplayNames(status);
        nonConstThis->addAllNamesIntoTrie(status);
        nonConstThis->fNamesTrieFullyLoaded = TRUE;
        if (U_FAILURE(status)) { return NULL; }

        // Third try: we must return this one.
        return doFind(handler, text, start, status);
    }
}